

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  Colour local_19 [8];
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001835c0 = 0x2d2d2d2d2d2d2d;
    uRam00000000001835c7 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001835b0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001835b8 = 0x2d2d2d2d2d2d2d;
    DAT_001835bf = 0x2d;
    _DAT_001835a0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001835a8 = 0x2d2d2d2d2d2d2d2d;
    _DAT_00183590 = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000183598 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000183588 = 0x2d2d2d2d2d2d2d2d;
    DAT_001835cf = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,"\n");
  local_19[0].m_moved = false;
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(local_19);
  return;
}

Assistant:

void printOpenHeader(std::string const& _name) {
			stream << getLineOfChars<'-'>() << "\n";
			{
				Colour colourGuard(Colour::Headers);
				printHeaderString(_name);
			}
		}